

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromLengths(HuffmanTree *tree,uint *bitlen,size_t numcodes,uint maxbitlen)

{
  uint *puVar1;
  uint in_ECX;
  ulong in_RDX;
  long in_RSI;
  HuffmanTree *in_RDI;
  uint i;
  uint local_28;
  uint local_4;
  
  puVar1 = (uint *)lodepng_malloc(0x135dc5);
  in_RDI->lengths = puVar1;
  if (in_RDI->lengths == (uint *)0x0) {
    local_4 = 0x53;
  }
  else {
    for (local_28 = 0; local_28 != in_RDX; local_28 = local_28 + 1) {
      in_RDI->lengths[local_28] = *(uint *)(in_RSI + (ulong)local_28 * 4);
    }
    in_RDI->numcodes = (uint)in_RDX;
    in_RDI->maxbitlen = in_ECX;
    local_4 = HuffmanTree_makeFromLengths2(in_RDI);
  }
  return local_4;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths(HuffmanTree* tree, const unsigned* bitlen,
                                            size_t numcodes, unsigned maxbitlen) {
  unsigned i;
  tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  for(i = 0; i != numcodes; ++i) tree->lengths[i] = bitlen[i];
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->maxbitlen = maxbitlen;
  return HuffmanTree_makeFromLengths2(tree);
}